

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddClip.c
# Opt level: O1

DdNode * Cudd_bddClippingAnd(DdManager *dd,DdNode *f,DdNode *g,int maxDepth,int direction)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddClippingAndRecur(dd,f,g,maxDepth,direction);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddClippingAnd(
  DdManager * dd /* manager */,
  DdNode * f /* first conjunct */,
  DdNode * g /* second conjunct */,
  int  maxDepth /* maximum recursion depth */,
  int  direction /* under (0) or over (1) approximation */)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddClippingAnd(dd,f,g,maxDepth,direction);
    } while (dd->reordered == 1);
    return(res);

}